

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O2

bool __thiscall jrtplib::RTPIPv6Address::IsFromSameHost(RTPIPv6Address *this,RTPAddress *addr)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  
  if ((addr != (RTPAddress *)0x0) && (addr->addresstype == IPv6Address)) {
    lVar3 = 0;
    do {
      bVar4 = lVar3 == 0x10;
      if (bVar4) {
        return bVar4;
      }
      pcVar1 = &(this->super_RTPAddress).field_0xc + lVar3;
      pcVar2 = &addr->field_0xc + lVar3;
      lVar3 = lVar3 + 1;
    } while (*pcVar1 == *pcVar2);
    return bVar4;
  }
  return false;
}

Assistant:

bool RTPIPv6Address::IsFromSameHost(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != RTPAddress::IPv6Address)
		return false;

	const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
	const uint8_t *ip2 = addr2->ip.s6_addr;
	for (int i = 0 ; i < 16 ; i++)
	{
		if (ip.s6_addr[i] != ip2[i])
			return false;
	}
	return true;
}